

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_mb_addr_inc(bitstream *str,uint32_t *val)

{
  int iVar1;
  uint uVar2;
  uint32_t tmp;
  uint32_t tmp_1;
  uint32_t c33;
  uint32_t local_34;
  uint local_30;
  uint32_t local_2c;
  
  if (str->dir == VS_ENCODE) {
    uVar2 = *val;
    local_2c = 0x21;
    local_30 = uVar2;
    if (0x20 < uVar2) {
      do {
        local_30 = uVar2;
        iVar1 = vs_vlc(str,&local_2c,mbai_vlc);
        if (iVar1 != 0) {
          return 1;
        }
        uVar2 = uVar2 - 0x21;
        local_30 = uVar2;
      } while (0x20 < uVar2);
    }
    iVar1 = vs_vlc(str,&local_30,mbai_vlc);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    *val = 0;
    iVar1 = vs_vlc(str,&local_34,mbai_vlc);
    if (iVar1 == 0) {
      do {
        if (local_34 != 0x22) {
          if (local_34 != 0x21) {
            *val = *val + local_34;
            return 0;
          }
          *val = *val + 0x21;
        }
        iVar1 = vs_vlc(str,&local_34,mbai_vlc);
      } while (iVar1 == 0);
    }
  }
  return 1;
}

Assistant:

int h262_mb_addr_inc(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		uint32_t tmp = *val, c33 = 33;
		while (tmp > 32) {
			if (vs_vlc(str, &c33, mbai_vlc)) return 1;
			tmp -= 33;
		}
		if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
	} else {
		*val = 0;
		uint32_t tmp;
		while (1) {
			if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
			if (tmp == 33) {
				*val += 33;
			} else if (tmp == 34) {
				/* stuffing */
			} else {
				*val += tmp;
				break;
			}
		}
	}
	return 0;
}